

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

string * __thiscall
pbrt::DebugMLTSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,DebugMLTSampler *this)

{
  vector<float,_std::allocator<float>_> *in_R8;
  string sStack_38;
  
  MLTSampler::ToString_abi_cxx11_(&sStack_38,&this->super_MLTSampler);
  StringPrintf<std::__cxx11::string,std::vector<float,std::allocator<float>>const&>
            (__return_storage_ptr__,(pbrt *)"[ DebugMLTSampler %s u: %s ]",(char *)&sStack_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->u,in_R8);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ DebugMLTSampler %s u: %s ]",
                            ((const MLTSampler *)this)->ToString(), u);
    }